

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *this,TPZVec<double> *pt,
          TPZFMatrix<double> *directions)

{
  undefined8 in_RSI;
  long *in_RDI;
  TPZFNMatrix<9,_double> gradx;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFMatrix<double> *in_stack_000006b8;
  TPZFMatrix<double> *in_stack_000006c0;
  int64_t in_stack_fffffffffffffc50;
  int64_t in_stack_fffffffffffffc58;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffc60;
  double *in_stack_fffffffffffffc68;
  int64_t in_stack_fffffffffffffc70;
  int64_t in_stack_fffffffffffffc78;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffc80;
  
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc68);
  (**(code **)(*in_RDI + 0x230))(in_RDI,in_RSI,&stack0xfffffffffffffc58);
  pztopology::TPZPyramid::ComputeHDivDirections<double>(in_stack_000006c0,in_stack_000006b8);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x181a714);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x181a721);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x181a72e);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x181a73b);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> jac(TGeo::Dimension,TGeo::Dimension), jacinv(TGeo::Dimension,TGeo::Dimension), axes(TGeo::Dimension,3), gradx(3,TGeo::Dimension,0.);
  
    this->GradX(pt, gradx);

    TGeo::ComputeHDivDirections(gradx, directions);
    
}